

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blind_item_strategy.cpp
# Opt level: O1

void __thiscall
BlindItemStrategy::generateActions(BlindItemStrategy *this,PlayerSight *sight,Actions *actions)

{
  uint uVar1;
  Randomizer *this_00;
  int iVar2;
  int iVar3;
  Vec2 pos;
  
  if (this->field_0xc == '\0') {
    iVar3 = sight->gold;
    if ((0x18 < iVar3) &&
       ((this->prevBomb == -1 ||
        (iVar2 = sight->round - this->prevBomb,
        (iVar2 * -0x11111111 + 0x8888888U >> 2 | iVar2 * -0x40000000) < 0x4444445)))) {
      this->prevBomb = sight->round;
      Actions::emplace(actions,BuyItem,0);
      this_00 = Randomizer::getInstance();
      pos = Randomizer::randPosition(this_00);
      Actions::emplace(actions,UseItem,0,pos);
      iVar3 = iVar3 + -0x19;
    }
    if ((4 < iVar3) &&
       ((this->prevWard == -1 ||
        (uVar1 = (sight->round - this->prevWard) * -0x69d0369d + 0x1b4e81a,
        (uVar1 >> 1 | (uint)((uVar1 & 1) != 0) << 0x1f) < 0x1b4e81b)))) {
      this->prevWard = sight->round;
      Actions::emplace(actions,BuyItem,1);
      Actions::emplace(actions,UseItem,1,sight->pos);
      return;
    }
  }
  return;
}

Assistant:

void BlindItemStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    int gold = sight.gold;
    if (gold >= BombPrice)
    {
        bool flag = false;
        if (prevBomb == -1)
            flag = true;
        else if ((sight.round - prevBomb) % BombCD == 0)
            flag = true;
        if (flag)
        {
            prevBomb = sight.round;
            actions->emplace(BuyItem, BombItem);
            actions->emplace(UseItem, BombItem, Randomizer::getInstance()->randPosition());
            gold -= BombPrice;
        }
    }
    if (gold >= WardPrice)
    {
        bool flag = false;
        if (prevWard == -1)
            flag = true;
        else if ((sight.round - prevWard) % WardCD == 0)
            flag = true;
        if (flag)
        {
            prevWard = sight.round;
            actions->emplace(BuyItem, WardItem);
            actions->emplace(UseItem, WardItem, sight.pos);
        }
    }
}